

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::disk_config::parse_fileio(disk_config *this)

{
  bool bVar1;
  reference pbVar2;
  reference pvVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  string local_1128 [32];
  ostringstream local_1108 [8];
  ostringstream msg_9;
  string local_f88 [32];
  ostringstream local_f68 [8];
  ostringstream msg_8;
  string local_de8 [32];
  ostringstream local_dc8 [8];
  ostringstream msg_7;
  string local_c48 [32];
  ostringstream local_c28 [8];
  ostringstream msg_6;
  char *local_ab0;
  char *endp_2;
  string local_aa0 [32];
  ostringstream local_a80 [8];
  ostringstream msg_5;
  char *local_908;
  char *endp_1;
  string local_8f8 [32];
  ostringstream local_8d8 [8];
  ostringstream msg_4;
  string local_758 [32];
  ostringstream local_738 [8];
  ostringstream msg_3;
  char *local_5c0;
  char *endp;
  string local_5b0 [32];
  ostringstream local_590 [8];
  ostringstream msg_2;
  string local_410 [32];
  ostringstream local_3f0 [8];
  ostringstream msg_1;
  string local_270 [32];
  ostringstream local_250 [8];
  ostringstream msg;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eq;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  const_iterator p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param;
  string local_80 [32];
  undefined1 local_60 [8];
  string paramstr;
  size_t spacepos;
  long local_18;
  size_t leadspace;
  disk_config *this_local;
  
  leadspace = (size_t)this;
  local_18 = std::__cxx11::string::find_first_not_of((char)this + '(',0x20);
  if (local_18 != 0) {
    std::__cxx11::string::substr((ulong)&spacepos,(ulong)&this->io_impl);
    std::__cxx11::string::operator=((string *)&this->io_impl,(string *)&spacepos);
    std::__cxx11::string::~string((string *)&spacepos);
  }
  paramstr.field_2._8_8_ = std::__cxx11::string::find((char)this + '(',0x20);
  if (paramstr.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)&this->io_impl);
    std::__cxx11::string::substr((ulong)local_80,(ulong)&this->io_impl);
    std::__cxx11::string::operator=((string *)&this->io_impl,local_80);
    std::__cxx11::string::~string(local_80);
    tlx::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p,' ',(string *)local_60,0xffffffffffffffff);
    local_b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_b0,&local_b8);
    while( true ) {
      eq.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&p);
      bVar1 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&eq.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_b0);
      tlx::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d8,'=',pbVar2,2,2);
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_b0);
      bVar1 = std::operator==(pbVar2,"");
      if (bVar1) goto LAB_001a4320;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_b0);
      bVar1 = std::operator==(pbVar2,"autogrow");
      if (bVar1) {
LAB_001a2ab8:
        pbVar2 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_b0);
        bVar1 = std::operator==(pbVar2,"autogrow");
        if (bVar1) {
          this->autogrow = true;
        }
        else {
          pbVar2 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_b0);
          bVar1 = std::operator==(pbVar2,"noautogrow");
          if (bVar1) {
            this->autogrow = false;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_d8,1);
            bVar1 = std::operator==(pvVar3,"off");
            if (bVar1) {
              this->autogrow = false;
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_d8,1);
              bVar1 = std::operator==(pvVar3,"on");
              if (bVar1) {
                this->autogrow = true;
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_d8,1);
                bVar1 = std::operator==(pvVar3,"no");
                if (bVar1) {
                  this->autogrow = false;
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_d8,1);
                  bVar1 = std::operator==(pvVar3,"yes");
                  if (!bVar1) {
                    std::__cxx11::ostringstream::ostringstream(local_250);
                    poVar6 = std::operator<<((ostream *)local_250,"Error in ");
                    poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                    poVar6 = std::operator<<(poVar6," : ");
                    poVar6 = std::operator<<(poVar6,"Invalid parameter \'");
                    pbVar2 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_b0);
                    poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                    std::operator<<(poVar6,"\' in disk configuration file.");
                    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::ostringstream::str();
                    std::runtime_error::runtime_error(prVar7,local_270);
                    __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  this->autogrow = true;
                }
              }
            }
          }
        }
      }
      else {
        pbVar2 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_b0);
        bVar1 = std::operator==(pbVar2,"noautogrow");
        if (bVar1) goto LAB_001a2ab8;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d8,0);
        bVar1 = std::operator==(pvVar3,"autogrow");
        if (bVar1) goto LAB_001a2ab8;
        pbVar2 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_b0);
        bVar1 = std::operator==(pbVar2,"delete");
        if (bVar1) {
LAB_001a2e3b:
          this->delete_on_exit = true;
        }
        else {
          pbVar2 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_b0);
          bVar1 = std::operator==(pbVar2,"delete_on_exit");
          if (bVar1) goto LAB_001a2e3b;
          pbVar2 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_b0);
          bVar1 = std::operator==(pbVar2,"direct");
          if (bVar1) {
LAB_001a2edf:
            pbVar2 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_b0);
            bVar1 = std::operator==(pbVar2,"direct");
            if (bVar1) {
              this->direct = DIRECT_ON;
            }
            else {
              pbVar2 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_b0);
              bVar1 = std::operator==(pbVar2,"nodirect");
              if (bVar1) {
                this->direct = DIRECT_OFF;
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_d8,1);
                bVar1 = std::operator==(pvVar3,"off");
                if (bVar1) {
                  this->direct = DIRECT_OFF;
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_d8,1);
                  bVar1 = std::operator==(pvVar3,"try");
                  if (bVar1) {
                    this->direct = DIRECT_TRY;
                  }
                  else {
                    pvVar3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_d8,1);
                    bVar1 = std::operator==(pvVar3,"on");
                    if (bVar1) {
                      this->direct = DIRECT_ON;
                    }
                    else {
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_d8,1);
                      bVar1 = std::operator==(pvVar3,"no");
                      if (bVar1) {
                        this->direct = DIRECT_OFF;
                      }
                      else {
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_d8,1);
                        bVar1 = std::operator==(pvVar3,"yes");
                        if (!bVar1) {
                          std::__cxx11::ostringstream::ostringstream(local_3f0);
                          poVar6 = std::operator<<((ostream *)local_3f0,"Error in ");
                          poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()"
                                                  );
                          poVar6 = std::operator<<(poVar6," : ");
                          poVar6 = std::operator<<(poVar6,"Invalid parameter \'");
                          pbVar2 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&local_b0);
                          poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                          std::operator<<(poVar6,"\' in disk configuration file.");
                          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::ostringstream::str();
                          std::runtime_error::runtime_error(prVar7,local_410);
                          __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        this->direct = DIRECT_ON;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            pbVar2 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_b0);
            bVar1 = std::operator==(pbVar2,"nodirect");
            if (bVar1) goto LAB_001a2edf;
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_d8,0);
            bVar1 = std::operator==(pvVar3,"direct");
            if (bVar1) goto LAB_001a2edf;
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_d8,0);
            bVar1 = std::operator==(pvVar3,"queue");
            if (bVar1) {
              bVar1 = std::operator==(&this->io_impl,"linuxaio");
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream(local_590);
                poVar6 = std::operator<<((ostream *)local_590,"Error in ");
                poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                poVar6 = std::operator<<(poVar6," : ");
                poVar6 = std::operator<<(poVar6,"Parameter \'");
                pbVar2 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_b0);
                poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                poVar6 = std::operator<<(poVar6,"\' invalid for fileio \'");
                poVar6 = std::operator<<(poVar6,(string *)&this->io_impl);
                std::operator<<(poVar6,"\' in disk configuration file.");
                endp._7_1_ = 1;
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::ostringstream::str();
                std::runtime_error::runtime_error(prVar7,local_5b0);
                endp._7_1_ = 0;
                __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d8,1);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              uVar5 = strtoul(pcVar4,&local_5c0,10);
              this->queue = (int)uVar5;
              if ((local_5c0 != (char *)0x0) && (*local_5c0 != '\0')) {
                std::__cxx11::ostringstream::ostringstream(local_738);
                poVar6 = std::operator<<((ostream *)local_738,"Error in ");
                poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                poVar6 = std::operator<<(poVar6," : ");
                poVar6 = std::operator<<(poVar6,"Invalid parameter \'");
                pbVar2 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_b0);
                poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                std::operator<<(poVar6,"\' in disk configuration file.");
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::ostringstream::str();
                std::runtime_error::runtime_error(prVar7,local_758);
                __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_d8,0);
              bVar1 = std::operator==(pvVar3,"queue_length");
              if (bVar1) {
                bVar1 = std::operator!=(&this->io_impl,"linuxaio");
                if (bVar1) {
                  std::__cxx11::ostringstream::ostringstream(local_8d8);
                  poVar6 = std::operator<<((ostream *)local_8d8,"Error in ");
                  poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                  poVar6 = std::operator<<(poVar6," : ");
                  poVar6 = std::operator<<(poVar6,"Parameter \'");
                  pbVar2 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_b0);
                  poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                  std::operator<<(poVar6,
                                  "\' is only valid for fileio linuxaio in disk configuration file."
                                 );
                  endp_1._7_1_ = 1;
                  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::ostringstream::str();
                  std::runtime_error::runtime_error(prVar7,local_8f8);
                  endp_1._7_1_ = 0;
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,1);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                uVar5 = strtoul(pcVar4,&local_908,10);
                this->queue_length = (int)uVar5;
                if ((local_908 != (char *)0x0) && (*local_908 != '\0')) {
                  std::__cxx11::ostringstream::ostringstream(local_a80);
                  poVar6 = std::operator<<((ostream *)local_a80,"Error in ");
                  poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                  poVar6 = std::operator<<(poVar6," : ");
                  poVar6 = std::operator<<(poVar6,"Invalid parameter \'");
                  pbVar2 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_b0);
                  poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                  std::operator<<(poVar6,"\' in disk configuration file.");
                  endp_2._7_1_ = 1;
                  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::ostringstream::str();
                  std::runtime_error::runtime_error(prVar7,local_aa0);
                  endp_2._7_1_ = 0;
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_d8,0);
                bVar1 = std::operator==(pvVar3,"device_id");
                if (!bVar1) {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_d8,0);
                  bVar1 = std::operator==(pvVar3,"devid");
                  if (!bVar1) {
                    pbVar2 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_b0);
                    bVar1 = std::operator==(pbVar2,"raw_device");
                    if (bVar1) {
                      bVar1 = std::operator==(&this->io_impl,"syscall");
                      if (!bVar1) {
                        std::__cxx11::ostringstream::ostringstream(local_dc8);
                        poVar6 = std::operator<<((ostream *)local_dc8,"Error in ");
                        poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                        poVar6 = std::operator<<(poVar6," : ");
                        poVar6 = std::operator<<(poVar6,"Parameter \'");
                        pbVar2 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_b0);
                        poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                        poVar6 = std::operator<<(poVar6,"\' invalid for fileio \'");
                        poVar6 = std::operator<<(poVar6,(string *)&this->io_impl);
                        std::operator<<(poVar6,"\' in disk configuration file.");
                        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::ostringstream::str();
                        std::runtime_error::runtime_error(prVar7,local_de8);
                        __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      this->raw_device = true;
                    }
                    else {
                      pbVar2 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&local_b0);
                      bVar1 = std::operator==(pbVar2,"unlink");
                      if (!bVar1) {
                        pbVar2 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_b0);
                        bVar1 = std::operator==(pbVar2,"unlink_on_open");
                        if (!bVar1) {
                          std::__cxx11::ostringstream::ostringstream(local_1108);
                          poVar6 = std::operator<<((ostream *)local_1108,"Error in ");
                          poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()"
                                                  );
                          poVar6 = std::operator<<(poVar6," : ");
                          poVar6 = std::operator<<(poVar6,"Invalid optional parameter \'");
                          pbVar2 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&local_b0);
                          poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                          std::operator<<(poVar6,"\' in disk configuration file.");
                          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::ostringstream::str();
                          std::runtime_error::runtime_error(prVar7,local_1128);
                          __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      bVar1 = std::operator==(&this->io_impl,"syscall");
                      if (((!bVar1) && (bVar1 = std::operator==(&this->io_impl,"linuxaio"), !bVar1))
                         && (bVar1 = std::operator==(&this->io_impl,"mmap"), !bVar1)) {
                        std::__cxx11::ostringstream::ostringstream(local_f68);
                        poVar6 = std::operator<<((ostream *)local_f68,"Error in ");
                        poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                        poVar6 = std::operator<<(poVar6," : ");
                        poVar6 = std::operator<<(poVar6,"Parameter \'");
                        pbVar2 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_b0);
                        poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                        poVar6 = std::operator<<(poVar6,"\' invalid for fileio \'");
                        poVar6 = std::operator<<(poVar6,(string *)&this->io_impl);
                        std::operator<<(poVar6,"\' in disk configuration file.");
                        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::ostringstream::str();
                        std::runtime_error::runtime_error(prVar7,local_f88);
                        __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      this->unlink_on_open = true;
                    }
                    goto LAB_001a4320;
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,1);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                uVar5 = strtoul(pcVar4,&local_ab0,10);
                this->device_id = (uint)uVar5;
                if ((local_ab0 != (char *)0x0) && (*local_ab0 != '\0')) {
                  std::__cxx11::ostringstream::ostringstream(local_c28);
                  poVar6 = std::operator<<((ostream *)local_c28,"Error in ");
                  poVar6 = std::operator<<(poVar6,"void foxxll::disk_config::parse_fileio()");
                  poVar6 = std::operator<<(poVar6," : ");
                  poVar6 = std::operator<<(poVar6,"Invalid parameter \'");
                  pbVar2 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_b0);
                  poVar6 = std::operator<<(poVar6,(string *)pbVar2);
                  std::operator<<(poVar6,"\' in disk configuration file.");
                  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::ostringstream::str();
                  std::runtime_error::runtime_error(prVar7,local_c48);
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
      }
LAB_001a4320:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&p);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void disk_config::parse_fileio()
{
    // skip over leading spaces
    size_t leadspace = io_impl.find_first_not_of(' ');
    if (leadspace > 0)
        io_impl = io_impl.substr(leadspace);

    // split off extra fileio parameters
    size_t spacepos = io_impl.find(' ');
    if (spacepos == std::string::npos)
        return; // no space in fileio

    // *** Parse Extra Fileio Parameters ***

    std::string paramstr = io_impl.substr(spacepos + 1);
    io_impl = io_impl.substr(0, spacepos);

    std::vector<std::string> param = tlx::split(' ', paramstr);

    for (std::vector<std::string>::const_iterator p = param.begin();
         p != param.end(); ++p)
    {
        // split at equal sign
        std::vector<std::string> eq = tlx::split('=', *p, 2, 2);

        // *** PLEASE try to keep the elseifs sorted by parameter name!
        if (*p == "") {
            // skip blank options
        }
        else if (*p == "autogrow" || *p == "noautogrow" || eq[0] == "autogrow")
        {
            // TODO: which fileio implementation support autogrow?

            if (*p == "autogrow") autogrow = true;
            else if (*p == "noautogrow") autogrow = false;
            else if (eq[1] == "off") autogrow = false;
            else if (eq[1] == "on") autogrow = true;
            else if (eq[1] == "no") autogrow = false;
            else if (eq[1] == "yes") autogrow = true;
            else
            {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (*p == "delete" || *p == "delete_on_exit")
        {
            delete_on_exit = true;
        }
        else if (*p == "direct" || *p == "nodirect" || eq[0] == "direct")
        {
            // io_impl is not checked here, but I guess that is okay for DIRECT
            // since it depends highly platform _and_ build-time configuration.

            if (*p == "direct") direct = DIRECT_ON;          // force ON
            else if (*p == "nodirect") direct = DIRECT_OFF;  // force OFF
            else if (eq[1] == "off") direct = DIRECT_OFF;
            else if (eq[1] == "try") direct = DIRECT_TRY;
            else if (eq[1] == "on") direct = DIRECT_ON;
            else if (eq[1] == "no") direct = DIRECT_OFF;
            else if (eq[1] == "yes") direct = DIRECT_ON;
            else
            {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "queue")
        {
            if (io_impl == "linuxaio") {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            char* endp;
            queue = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "queue_length")
        {
            if (io_impl != "linuxaio") {
                FOXXLL_THROW(
                    std::runtime_error, "Parameter '" << *p << "' "
                        "is only valid for fileio linuxaio "
                        "in disk configuration file."
                );
            }

            char* endp;
            queue_length = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "device_id" || eq[0] == "devid")
        {
            char* endp;
            device_id = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (*p == "raw_device")
        {
            if (!(io_impl == "syscall")) {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            raw_device = true;
        }
        else if (*p == "unlink" || *p == "unlink_on_open")
        {
            if (!(io_impl == "syscall" || io_impl == "linuxaio" ||
                  io_impl == "mmap"))
            {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            unlink_on_open = true;
        }
        else
        {
            FOXXLL_THROW(
                std::runtime_error,
                "Invalid optional parameter '" << *p << "' in disk configuration file."
            );
        }
    }
}